

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pal_file.cpp
# Opt level: O2

HANDLE GetStdHandle(DWORD nStdHandle)

{
  int *piVar1;
  HANDLE pVVar2;
  
  if (PAL_InitializeChakraCoreCalled) {
    CorUnix::InternalGetCurrentThread();
    pVVar2 = pStdErr;
    if (((nStdHandle != 0xfffffff4) && (pVVar2 = pStdOut, nStdHandle != 0xfffffff5)) &&
       (pVVar2 = pStdIn, nStdHandle != 0xfffffff6)) {
      if (PAL_InitializeChakraCoreCalled == false) goto LAB_001242c9;
      piVar1 = __errno_location();
      *piVar1 = 0x57;
      pVVar2 = (HANDLE)0xffffffffffffffff;
    }
    if (PAL_InitializeChakraCoreCalled != false) {
      return pVVar2;
    }
  }
LAB_001242c9:
  abort();
}

Assistant:

HANDLE
PALAPI
GetStdHandle(
         IN DWORD nStdHandle)
{
    CPalThread *pThread;
    HANDLE hRet = INVALID_HANDLE_VALUE;

    PERF_ENTRY(GetStdHandle);
    ENTRY("GetStdHandle(nStdHandle=%#x)\n", nStdHandle);

    pThread = InternalGetCurrentThread();
    switch( nStdHandle )
    {
    case STD_INPUT_HANDLE:
        hRet = pStdIn;
        break;
    case STD_OUTPUT_HANDLE:
        hRet = pStdOut;
        break;
    case STD_ERROR_HANDLE:
        hRet = pStdErr; 
        break;
    default:
        ERROR("nStdHandle is invalid\n");
        pThread->SetLastError(ERROR_INVALID_PARAMETER);
        break;
    }

    LOGEXIT("GetStdHandle returns HANDLE %p\n", hRet);
    PERF_EXIT(GetStdHandle);
    return hRet;
}